

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O2

void __thiscall Json::StyledWriter::writeIndent(StyledWriter *this)

{
  string *psVar1;
  char cVar2;
  size_type sVar3;
  
  psVar1 = &this->document_;
  sVar3 = (this->document_)._M_string_length;
  if ((sVar3 != 0) && (cVar2 = (psVar1->_M_dataplus)._M_p[sVar3 - 1], cVar2 != '\n')) {
    if (cVar2 == ' ') {
      return;
    }
    std::__cxx11::string::push_back((char)psVar1);
  }
  std::__cxx11::string::append((string *)psVar1);
  return;
}

Assistant:

void StyledWriter::writeIndent() {
  if (!document_.empty()) {
    char last = document_[document_.length() - 1];
    if (last == ' ') // already indented
      return;
    if (last != '\n') // Comments may add new-line
      document_ += '\n';
  }
  document_ += indentString_;
}